

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>::
invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  const_iterator rollback;
  bool bVar1;
  const_iterator other;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_00;
  long lVar2;
  region<std::vector<char,_std::allocator<char>_>_> retval;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  
  region<std::vector<char,_std::allocator<char>_>_>::region
            (&retval,(location<std::vector<char,_std::allocator<char>_>_> *)this);
  rollback._M_current = *(char **)(this + 0x40);
  lVar2 = 4;
  loc_00 = extraout_RDX;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      region<std::vector<char,_std::allocator<char>_>_>::region
                ((region<std::vector<char,_std::allocator<char>_>_> *)&rslt,&retval);
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::result(__return_storage_ptr__,(success_type *)&rslt);
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)&rslt);
      break;
    }
    character<(char)39>::invoke<std::vector<char,std::allocator<char>>>
              (&rslt,(character<(char)39> *)this,loc_00);
    bVar1 = rslt.is_ok_;
    if (rslt.is_ok_ == false) {
      other._M_current = rollback._M_current;
      location<std::vector<char,_std::allocator<char>_>_>::reset
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
      __return_storage_ptr__->is_ok_ = false;
    }
    else {
      other._M_current =
           (char *)result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                   ::unwrap(&rslt);
      region<std::vector<char,_std::allocator<char>_>_>::operator+=
                (&retval,(region<std::vector<char,_std::allocator<char>_>_> *)other._M_current);
    }
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    cleanup(&rslt,(EVP_PKEY_CTX *)other._M_current);
    loc_00 = extraout_RDX_00;
  } while (bVar1 != false);
  region<std::vector<char,_std::allocator<char>_>_>::~region(&retval);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        region<Cont> retval(loc);
        const auto first = loc.iter();
        for(std::size_t i=0; i<N; ++i)
        {
            auto rslt = T::invoke(loc);
            if(rslt.is_err())
            {
                loc.reset(first);
                return none();
            }
            retval += rslt.unwrap();
        }
        return ok(std::move(retval));
    }